

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
 mp::internal::
 UncheckedCast<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
           (Expr e)

{
  Impl *in_RDI;
  BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58> *basic;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  expr;
  BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58> *local_20;
  BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58> *local_18;
  ExprBase local_10;
  BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58> local_8;
  
  local_10.impl_ = in_RDI;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  ::BasicBinaryExpr((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                     *)0x19dd43);
  local_20 = &local_8;
  local_18 = local_20;
  Unused<mp::BasicExpr<(mp::expr::Kind)53,(mp::expr::Kind)58>*>(&local_20);
  return (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
          )local_10.impl_;
}

Assistant:

inline ExprType internal::UncheckedCast(Expr e) {
  MP_ASSERT(Is<ExprType>(e.kind()), "invalid cast");
  ExprType expr;
  // Make sure that ExprType is a subclass or an instance of BasicExpr.
  BasicExpr<static_cast<expr::Kind>(ExprType::FIRST_KIND),
            static_cast<expr::Kind>(ExprType::LAST_KIND)> &basic = expr;
  internal::Unused(&basic);
  expr.impl_ = e.impl_;
  return expr;
}